

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalToolButton::paintEvent(QCalToolButton *this,QPaintEvent *e)

{
  long lVar1;
  bool bVar2;
  QPalette *pQVar3;
  QColor *acolor;
  long in_FS_OFFSET;
  undefined1 local_c8 [16];
  QStyleOptionToolButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&opt,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&opt);
  (**(code **)(*(long *)&(this->super_QToolButton).super_QAbstractButton.super_QWidget + 0x1b8))
            (this,&opt);
  if ((opt.super_QStyleOptionComplex.super_QStyleOption.state.
       super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i.
       _1_1_ & 0x20) == 0) {
    bVar2 = QAbstractButton::isDown((QAbstractButton *)this);
    if (!bVar2) {
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = QWidget::palette((QWidget *)this);
      QPalette::QPalette((QPalette *)local_c8,pQVar3);
      acolor = QPalette::color((QPalette *)local_c8,HighlightedText);
      QPalette::setColor((QPalette *)local_c8,ButtonText,acolor);
      goto LAB_003aa29d;
    }
  }
  QPalette::QPalette((QPalette *)local_c8);
LAB_003aa29d:
  QWidget::setPalette((QWidget *)this,(QPalette *)local_c8);
  QPalette::~QPalette((QPalette *)local_c8);
  QToolButton::paintEvent(&this->super_QToolButton,e);
  QStyleOptionToolButton::~QStyleOptionToolButton(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *e) override
    {
        Q_UNUSED(e);

        QStyleOptionToolButton opt;
        initStyleOption(&opt);

        if (opt.state & QStyle::State_MouseOver || isDown()) {
            //act as normal button
            setPalette(QPalette());
        } else {
            //set the highlight color for button text
            QPalette toolPalette = palette();
            toolPalette.setColor(QPalette::ButtonText, toolPalette.color(QPalette::HighlightedText));
            setPalette(toolPalette);
        }

        QToolButton::paintEvent(e);
    }